

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O3

StatusOr<unsigned_int> * __thiscall
google::protobuf::util::converter::DataPiece::ToUint32
          (StatusOr<unsigned_int> *__return_storage_ptr__,DataPiece *this)

{
  Type TVar1;
  uint in_EDX;
  
  TVar1 = this->type_;
  if (TVar1 == TYPE_DOUBLE) {
    (anonymous_namespace)::ValidateNumberConversion<unsigned_int,double>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).double_,in_EDX,
               (this->field_2).double_);
  }
  else if (TVar1 == TYPE_FLOAT) {
    (anonymous_namespace)::ValidateNumberConversion<unsigned_int,float>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).float_,in_EDX,
               (this->field_2).float_);
  }
  else if (TVar1 == TYPE_STRING) {
    StringToNumber<unsigned_int>(__return_storage_ptr__,this,safe_strtou32);
  }
  else {
    GenericConvert<unsigned_int>(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<uint32> DataPiece::ToUint32() const {
  if (type_ == TYPE_STRING)
    return StringToNumber<uint32>(safe_strtou32);

  if (type_ == TYPE_DOUBLE)
    return FloatingPointToIntConvertAndCheck<uint32, double>(double_);

  if (type_ == TYPE_FLOAT)
    return FloatingPointToIntConvertAndCheck<uint32, float>(float_);

  return GenericConvert<uint32>();
}